

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void asm_make_ast(void *_line)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 *puVar4;
  long *plVar5;
  byte *pbVar6;
  byte *local_28;
  
  for (; (bVar1 = *_line, bVar1 == 9 || (bVar1 == 0x20)); _line = (void *)((long)_line + 1)) {
  }
  pbVar6 = (byte *)_line;
  if (bVar1 != 0) {
    while ((((byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar1 - 0x24 < 0x3c &&
            ((0x800000000000681U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))))) {
      bVar1 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    }
    local_28 = pbVar6;
    if (bVar1 == 0x3a) {
LAB_001026dc:
      puVar4 = (undefined4 *)malloc(0x10);
      *puVar4 = 0;
      *pbVar6 = 0;
      ptr_ll_add(cur_ast.nodes,puVar4);
      _line = pbVar6 + 1;
      pbVar6 = (byte *)_line;
      do {
        bVar1 = *pbVar6;
        if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
          uVar2 = bVar1 - 0x24;
          if (0x3b < uVar2) break;
          if ((0x800000000000681U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00102734;
        }
        pbVar6 = pbVar6 + 1;
      } while( true );
    }
LAB_0010273a:
    local_28 = pbVar6;
    if (*_line == 0x2e) {
      puVar4 = (undefined4 *)malloc(0x10);
      *puVar4 = 2;
      plVar5 = (long *)malloc(0x10);
      *(long **)(puVar4 + 2) = plVar5;
      *pbVar6 = 0;
      *plVar5 = (long)((long)_line + 1);
      bVar1 = *(byte *)((long)_line + 1);
      if (bVar1 != 0) {
        pbVar6 = (byte *)((long)_line + 2);
        do {
          if ('`' < (char)bVar1) {
            pbVar6[-1] = bVar1 - 0x20;
          }
          bVar1 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (bVar1 != 0);
      }
      ptr_ll_add(cur_ast.nodes,puVar4);
      return;
    }
    *pbVar6 = 0;
    bVar1 = *_line;
    pbVar6 = (byte *)_line;
    while (bVar1 != 0) {
      if ('`' < (char)bVar1) {
        *pbVar6 = bVar1 - 0x20;
      }
      bVar1 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    }
    iVar3 = strcmp("BRK",(char *)_line);
    if ((((iVar3 != 0) && (iVar3 = strcmp("ORA",(char *)_line), iVar3 != 0)) &&
        (iVar3 = strcmp("COP",(char *)_line), iVar3 != 0)) &&
       (((iVar3 = strcmp("TSB",(char *)_line), iVar3 != 0 &&
         (iVar3 = strcmp("ASL",(char *)_line), iVar3 != 0)) &&
        ((iVar3 = strcmp("PHP",(char *)_line), iVar3 != 0 &&
         (iVar3 = strcmp("PHD",(char *)_line), iVar3 != 0)))))) {
      iVar3 = strcmp("BPL",(char *)_line);
      if (iVar3 != 0) {
        iVar3 = strcmp("TRB",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("CLC",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("INC",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("TCS",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("JSR",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("AND",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        iVar3 = strcmp("JSL",(char *)_line);
        if (iVar3 == 0) {
          asm_parse_long((char **)&local_28);
          return;
        }
        iVar3 = strcmp("BIT",(char *)_line);
        if (iVar3 == 0) {
          return;
        }
        asm_make_ast_cold_1();
      }
      asm_parse_rel((char **)&local_28);
    }
  }
  return;
LAB_00102734:
  if ((ulong)uVar2 != 0x16) goto LAB_0010273a;
  goto LAB_001026dc;
}

Assistant:

void asm_make_ast(void *_line) {
    char *line = (char*)_line;
    while(*line == ' ' || *line == '\t') line++;
    if(*line == 0) return;
    char *opStart = line;
    while(
        (*line >= 'A' && *line <= 'Z') ||
        (*line >= 'a' && *line <= 'z') ||
        (*line >= '0' && *line <= '9') ||
        *line == '$' ||
        *line == '_' ||
        *line == '.' ||
        *line == '+' ||
        *line == '-'
    ) line++;

    while(*line == ':') {
        // Label
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 0;
        struct asm_ast_label *label = malloc(sizeof(struct asm_ast_label));
        *line = 0; // Nice null terminator ;)
        label->label = opStart;
        ptr_ll_add(cur_ast.nodes, node);

        // Right, now we need to reset in case there's a label or another instruction after this. Right.
        line++;
        opStart = line;
        while(
            (*line >= 'A' && *line <= 'Z') ||
            (*line >= 'a' && *line <= 'z') ||
            (*line >= '0' && *line <= '9') ||
            *line == '$' ||
            *line == '_' ||
            *line == '.' ||
            *line == '+' ||
            *line == '-'
        ) line++;
    }
    if(*opStart == '.') {
        opStart++; // Directive
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 2;
        struct asm_ast_directive *directive = malloc(sizeof(struct asm_ast_directive));
        node->node = directive;
        *line = 0; // Null terminate, as always
        directive->directive = opStart;
        while(*opStart != 0) { // And now, to capitalize
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        // I know that plenty of directives have parameters.
        // I'm going to ignore that for now, because I don't know what they are.
        ptr_ll_add(cur_ast.nodes, node);
    } else { // Instruction
        *line = 0; // Null terminate. Of course.
        char *trueOpStart = opStart;
        while(*opStart != 0) { // And now, to capitalize. Early.
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        opStart = trueOpStart;
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 1;
        struct asm_ast_instruction *instruction = malloc(sizeof(struct asm_ast_instruction));
        if(!strcmp("BRK", opStart)) { // Fun fact, !strcmp means they're equal.
            instruction->opcode = 0;
        } else if(!strcmp("ORA", opStart)) { // Opcodes $01, $03, $05, $07, $09, $0D, $0F, $11, $12, $13, $15, $17, $19, $1D, $1F
            
        } else if(!strcmp("COP", opStart)) {
            instruction->opcode = 2;
        } else if(!strcmp("TSB", opStart)) { // Opcodes $04, $0C
            
        } else if(!strcmp("ASL", opStart)) { // Opcodes $06, $0A, $0E, $16, $1E
            
        } else if(!strcmp("PHP", opStart)) {
            instruction->opcode = 8;
        } else if(!strcmp("PHD", opStart)) {
            instruction->opcode = 0xB;
        } else if(!strcmp("BPL", opStart)) {
            instruction->opcode = 0x10;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_rel(&line);
            instruction->params = params;
        } else if(!strcmp("TRB", opStart)) { // Opcodes $14, $1C
            
        } else if(!strcmp("CLC", opStart)) {
            instruction->opcode = 0x18;
        } else if(!strcmp("INC", opStart)) { // Opcodes $1A, $E6, $EE, $F6, $FE
            
        } else if(!strcmp("TCS", opStart)) {
            instruction->opcode = 0x1B;
        } else if(!strcmp("JSR", opStart)) { // Opcodes $20, $FC
            
        } else if(!strcmp("AND", opStart)) { // Opcodes $21, $23, $25, $27, $29, $2D, $2F, $31, $32, $33, $35, $37, $39, $3D, $3F
            
        } else if(!strcmp("JSL", opStart)) {
            instruction->opcode = 0x22;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_long(&line);
            instruction->params = params;
        } else if(!strcmp("BIT", opStart)) { // Opcodes $24, $2C, $34, $3C, $89
            
        } else {
            fprintf(stderr, "Error: unrecognized instruction \"%s\"!\n", opStart);
            exit(1);
        }
    }
}